

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap3-gui.cpp
# Opt level: O2

bool __thiscall TripleBuffer<stStateCore>::changed(TripleBuffer<stStateCore> *this)

{
  bool bVar1;
  
  std::mutex::lock(&this->mutex);
  bVar1 = this->hasChanged;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return bVar1;
}

Assistant:

bool changed() {
        std::lock_guard<std::mutex> lock(mutex);
        return hasChanged;
    }